

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

void __thiscall
Parser::WaitForBackgroundJobs(Parser *this,BackgroundParser *bgp,CompileScriptException *pse)

{
  int iVar1;
  LocalFunctionId LVar2;
  StmtNest *pSVar3;
  code *pcVar4;
  bool bVar5;
  JobProcessor *pJVar6;
  BackgroundParseItem *pBVar7;
  JobProcessor *pJVar8;
  undefined4 *puVar9;
  
  if (bgp->pendingBackgroundItems != 0) {
    this->m_isInBackground = true;
    this->currBackgroundParseItem = (BackgroundParseItem *)0x0;
    iVar1 = this->m_nextBlockId;
    LVar2 = *this->m_nextFunctionId;
    pSVar3 = this->m_pstmtCur;
    pJVar6 = JsUtil::JobManager::Processor((JobManager *)bgp);
    bVar5 = JsUtil::JobProcessor::ProcessesInBackground(pJVar6);
    if (bVar5) {
      pJVar6 = JsUtil::JobManager::Processor((JobManager *)bgp);
      pJVar6 = pJVar6 + 1;
      CCLock::Enter((CCLock *)pJVar6);
      pBVar7 = BackgroundParser::GetNextUnprocessedItem(bgp);
      while (pBVar7 != (BackgroundParseItem *)0x0) {
        pJVar8 = JsUtil::JobManager::Processor((JobManager *)bgp);
        (*pJVar8->_vptr_JobProcessor[3])(pJVar8,pBVar7);
        CCLock::Leave((CCLock *)pJVar6);
        bVar5 = BackgroundParser::Process(bgp,&pBVar7->super_Job,this,pse);
        CCLock::Enter((CCLock *)pJVar6);
        BackgroundParser::JobProcessed(bgp,&pBVar7->super_Job,bVar5);
        pBVar7 = BackgroundParser::GetNextUnprocessedItem(bgp);
      }
      CCLock::Leave((CCLock *)pJVar6);
      do {
      } while (bgp->pendingBackgroundItems != 0);
    }
    else {
      pBVar7 = BackgroundParser::GetNextUnprocessedItem(bgp);
      while (pBVar7 != (BackgroundParseItem *)0x0) {
        pJVar6 = JsUtil::JobManager::Processor((JobManager *)bgp);
        (*pJVar6->_vptr_JobProcessor[3])(pJVar6,pBVar7);
        bVar5 = BackgroundParser::Process(bgp,&pBVar7->super_Job,this,pse);
        BackgroundParser::JobProcessed(bgp,&pBVar7->super_Job,bVar5);
        pBVar7 = BackgroundParser::GetNextUnprocessedItem(bgp);
      }
      if (bgp->pendingBackgroundItems != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0x26a,"(!*bgp->GetPendingBackgroundItemsPtr())",
                           "!*bgp->GetPendingBackgroundItemsPtr()");
        if (!bVar5) goto LAB_00e67d50;
        *puVar9 = 0;
      }
    }
    if (bgp->pendingBackgroundItems != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x28c,"(!*bgp->GetPendingBackgroundItemsPtr())",
                         "!*bgp->GetPendingBackgroundItemsPtr()");
      if (!bVar5) {
LAB_00e67d50:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar9 = 0;
    }
    this->m_pstmtCur = pSVar3;
    this->m_isInBackground = false;
    this->m_nextBlockId = iVar1;
    *this->m_nextFunctionId = LVar2;
  }
  return;
}

Assistant:

void Parser::WaitForBackgroundJobs(BackgroundParser *bgp, CompileScriptException *pse)
{
    // The scan of the script is done, but there may be unfinished background jobs in the queue.
    // Enlist the main thread to help with those.
    BackgroundParseItem *item;
    if (!*bgp->GetPendingBackgroundItemsPtr())
    {
        // We're done.
        return;
    }

    // Save parser state, since we'll need to restore it in order to bind references correctly later.
    this->m_isInBackground = true;
    this->SetCurrBackgroundParseItem(nullptr);
    uint blockIdSave = this->m_nextBlockId;
    uint functionIdSave = *this->m_nextFunctionId;
    StmtNest *pstmtSave = this->m_pstmtCur;

    if (!bgp->Processor()->ProcessesInBackground())
    {
        // No background thread. Just walk the jobs with no locking and process them.
        for (item = bgp->GetNextUnprocessedItem(); item; item = bgp->GetNextUnprocessedItem())
        {
            bgp->Processor()->RemoveJob(item);
            bool succeeded = bgp->Process(item, this, pse);
            bgp->JobProcessed(item, succeeded);
        }
        Assert(!*bgp->GetPendingBackgroundItemsPtr());
    }
    else
    {
        // Background threads. We need to have the critical section in order to:
        // - Check for unprocessed jobs;
        // - Remove jobs from the processor queue;
        // - Do JobsProcessed work (such as removing jobs from the BackgroundParser's unprocessed list).
        CriticalSection *pcs = static_cast<JsUtil::BackgroundJobProcessor*>(bgp->Processor())->GetCriticalSection();
        pcs->Enter();
        for (;;)
        {
            // Grab a job (in lock)
            item = bgp->GetNextUnprocessedItem();
            if (item == nullptr)
            {
                break;
            }
            bgp->Processor()->RemoveJob(item);
            pcs->Leave();

            // Process job (if there is one) (outside lock)
            bool succeeded = bgp->Process(item, this, pse);

            pcs->Enter();
            bgp->JobProcessed(item, succeeded);
        }
        pcs->Leave();

        // Wait for the background threads to finish jobs they're already processing (if any).
        // TODO: Replace with a proper semaphore.
        while (*bgp->GetPendingBackgroundItemsPtr());
    }

    Assert(!*bgp->GetPendingBackgroundItemsPtr());

    // Restore parser state.
    this->m_pstmtCur = pstmtSave;
    this->m_isInBackground = false;
    this->m_nextBlockId = blockIdSave;
    *this->m_nextFunctionId = functionIdSave;
}